

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  ulong uVar1;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong *puVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  HUF_CStream_t bitC;
  
  if (7 < dstSize) {
    bitC.bitPos[0] = 0;
    bitC.bitPos[1] = 0;
    bitC.bitContainer[0] = 0;
    bitC.bitContainer[1] = 0;
    bitC.endPtr = (BYTE *)((long)dst + (dstSize - 8));
    if (dstSize == 8) {
      sVar6 = 0;
    }
    else {
      uVar2 = (uint)*CTable & 0xff;
      iVar7 = (int)srcSize;
      uVar9 = iVar7 >> 0x1f;
      bitC.ptr = (BYTE *)dst;
      if (uVar2 < 0xc && ((*CTable & 0xff) * srcSize >> 3) + 8 <= dstSize) {
        switch(uVar2) {
        case 7:
          uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 8;
          uVar14 = uVar13 & 0xffffffff;
          if (0 < (int)uVar13) {
            pbVar3 = (byte *)((long)iVar7 + (long)src);
            uVar13 = 0;
            while( true ) {
              pbVar3 = pbVar3 + -1;
              if ((int)uVar14 < 1) break;
              uVar15 = CTable[(ulong)*pbVar3 + 1];
              uVar13 = uVar13 + uVar15;
              bitC.bitContainer[0] =
                   uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
              uVar14 = (ulong)((int)uVar14 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            }
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)((long)dst + ((uVar13 & 0xff) >> 3));
          }
          if ((srcSize & 0xf) == 0) {
            lVar5 = (long)(int)srcSize;
          }
          else {
            lVar4 = (long)(int)srcSize;
            lVar5 = 7;
            while (lVar5 != 0) {
              uVar13 = CTable[(ulong)*(byte *)((long)src + lVar5 + lVar4 + -8) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar5 = lVar5 + -1;
            }
            lVar5 = lVar4 + -8;
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + -8) + 1];
            uVar14 = bitC.bitPos[0] + uVar13;
            bitC.bitContainer[0] =
                 uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
            *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
            bitC.ptr = bitC.ptr + ((uVar14 & 0xff) >> 3);
          }
          lVar8 = (long)src + lVar5 + -1;
          lVar4 = lVar5 + -9 + (long)src;
          for (; lVar12 = 7, 0 < lVar5; lVar5 = lVar5 + -0x10) {
            while (lVar12 != 0) {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -7 + lVar12) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar12 = lVar12 + -1;
            }
            uVar13 = CTable[(ulong)*(byte *)(lVar5 + -8 + (long)src) + 1];
            uVar15 = bitC.bitPos[0] + uVar13;
            uVar13 = uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            *(ulong *)bitC.ptr = uVar13 >> ((ulong)(byte)-(char)uVar15 & 0x3f);
            lVar11 = 0;
            uVar14 = 0;
            lVar12 = 7;
            while (lVar12 != 0) {
              uVar1 = CTable[(ulong)*(byte *)(lVar4 + -7 + lVar12) + 1];
              uVar14 = uVar14 >> (uVar1 & 0x3f) | uVar1;
              lVar11 = lVar11 + uVar1;
              lVar12 = lVar12 + -1;
            }
            uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -0x10) + 1];
            bitC.bitPos[1] = lVar11 + uVar1;
            bitC.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar14 >> (uVar1 & 0x3f);
            bitC.bitContainer[0] = uVar13 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
            uVar13 = bitC.bitPos[1] + ((uint)uVar15 & 7);
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)(bitC.ptr + ((uVar15 & 0xff) >> 3)) =
                 bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)(((uVar13 & 0xff) >> 3) + (long)(bitC.ptr + ((uVar15 & 0xff) >> 3)));
            lVar8 = lVar8 + -0x10;
            lVar4 = lVar4 + -0x10;
          }
          break;
        case 8:
          uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 7;
          uVar14 = uVar13 & 0xffffffff;
          if (0 < (int)uVar13) {
            pbVar3 = (byte *)((long)iVar7 + (long)src);
            uVar13 = 0;
            while( true ) {
              pbVar3 = pbVar3 + -1;
              if ((int)uVar14 < 1) break;
              uVar15 = CTable[(ulong)*pbVar3 + 1];
              uVar13 = uVar13 + uVar15;
              bitC.bitContainer[0] =
                   uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
              uVar14 = (ulong)((int)uVar14 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            }
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)((long)dst + ((uVar13 & 0xff) >> 3));
          }
          iVar7 = (int)srcSize;
          if ((int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | srcSize & 0xffffffff) % 0xe) == 0)
          {
            lVar5 = (long)iVar7;
          }
          else {
            lVar4 = (long)iVar7;
            lVar5 = 6;
            while (lVar5 != 0) {
              uVar13 = CTable[(ulong)*(byte *)((long)src + lVar5 + lVar4 + -7) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar5 = lVar5 + -1;
            }
            lVar5 = lVar4 + -7;
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + -7) + 1];
            uVar14 = bitC.bitPos[0] + uVar13;
            bitC.bitContainer[0] =
                 uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
            *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
            bitC.ptr = bitC.ptr + ((uVar14 & 0xff) >> 3);
          }
          lVar8 = (long)src + lVar5 + -1;
          lVar4 = lVar5 + -8 + (long)src;
          for (; lVar12 = 6, 0 < lVar5; lVar5 = lVar5 + -0xe) {
            while (lVar12 != 0) {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -6 + lVar12) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar12 = lVar12 + -1;
            }
            uVar13 = CTable[(ulong)*(byte *)(lVar5 + -7 + (long)src) + 1];
            uVar15 = bitC.bitPos[0] + uVar13;
            uVar13 = uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            *(ulong *)bitC.ptr = uVar13 >> ((ulong)(byte)-(char)uVar15 & 0x3f);
            lVar11 = 0;
            uVar14 = 0;
            lVar12 = 6;
            while (lVar12 != 0) {
              uVar1 = CTable[(ulong)*(byte *)(lVar4 + -6 + lVar12) + 1];
              uVar14 = uVar14 >> (uVar1 & 0x3f) | uVar1;
              lVar11 = lVar11 + uVar1;
              lVar12 = lVar12 + -1;
            }
            uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -0xe) + 1];
            bitC.bitPos[1] = lVar11 + uVar1;
            bitC.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar14 >> (uVar1 & 0x3f);
            bitC.bitContainer[0] = uVar13 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
            uVar13 = bitC.bitPos[1] + ((uint)uVar15 & 7);
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)(bitC.ptr + ((uVar15 & 0xff) >> 3)) =
                 bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)(((uVar13 & 0xff) >> 3) + (long)(bitC.ptr + ((uVar15 & 0xff) >> 3)));
            lVar8 = lVar8 + -0xe;
            lVar4 = lVar4 + -0xe;
          }
          break;
        case 9:
          uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 6;
          uVar14 = uVar13 & 0xffffffff;
          if (0 < (int)uVar13) {
            pbVar3 = (byte *)((long)iVar7 + (long)src);
            uVar13 = 0;
            while( true ) {
              pbVar3 = pbVar3 + -1;
              if ((int)uVar14 < 1) break;
              uVar15 = CTable[(ulong)*pbVar3 + 1];
              uVar13 = uVar13 + uVar15;
              bitC.bitContainer[0] =
                   uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
              uVar14 = (ulong)((int)uVar14 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            }
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)((long)dst + ((uVar13 & 0xff) >> 3));
          }
          iVar7 = (int)srcSize;
          if ((int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | srcSize & 0xffffffff) % 0xc) == 0)
          {
            lVar5 = (long)iVar7;
          }
          else {
            lVar4 = (long)iVar7;
            lVar5 = 5;
            while (lVar5 != 0) {
              uVar13 = CTable[(ulong)*(byte *)((long)src + lVar5 + lVar4 + -6) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar5 = lVar5 + -1;
            }
            lVar5 = lVar4 + -6;
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + -6) + 1];
            uVar14 = bitC.bitPos[0] + uVar13;
            bitC.bitContainer[0] =
                 uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
            *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
            bitC.ptr = bitC.ptr + ((uVar14 & 0xff) >> 3);
          }
          lVar8 = (long)src + lVar5 + -1;
          lVar4 = lVar5 + -7 + (long)src;
          for (; lVar12 = 5, 0 < lVar5; lVar5 = lVar5 + -0xc) {
            while (lVar12 != 0) {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -5 + lVar12) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar12 = lVar12 + -1;
            }
            uVar13 = CTable[(ulong)*(byte *)(lVar5 + -6 + (long)src) + 1];
            uVar15 = bitC.bitPos[0] + uVar13;
            uVar13 = uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            *(ulong *)bitC.ptr = uVar13 >> ((ulong)(byte)-(char)uVar15 & 0x3f);
            lVar11 = 0;
            uVar14 = 0;
            lVar12 = 5;
            while (lVar12 != 0) {
              uVar1 = CTable[(ulong)*(byte *)(lVar4 + -5 + lVar12) + 1];
              uVar14 = uVar14 >> (uVar1 & 0x3f) | uVar1;
              lVar11 = lVar11 + uVar1;
              lVar12 = lVar12 + -1;
            }
            uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -0xc) + 1];
            bitC.bitPos[1] = lVar11 + uVar1;
            bitC.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar14 >> (uVar1 & 0x3f);
            bitC.bitContainer[0] = uVar13 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
            uVar13 = bitC.bitPos[1] + ((uint)uVar15 & 7);
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)(bitC.ptr + ((uVar15 & 0xff) >> 3)) =
                 bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)(((uVar13 & 0xff) >> 3) + (long)(bitC.ptr + ((uVar15 & 0xff) >> 3)));
            lVar8 = lVar8 + -0xc;
            lVar4 = lVar4 + -0xc;
          }
          break;
        case 10:
          uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 5;
          uVar14 = uVar13 & 0xffffffff;
          if (0 < (int)uVar13) {
            pbVar3 = (byte *)((long)iVar7 + (long)src);
            uVar13 = 0;
            while( true ) {
              pbVar3 = pbVar3 + -1;
              if ((int)uVar14 < 1) break;
              uVar15 = CTable[(ulong)*pbVar3 + 1];
              uVar13 = uVar13 + uVar15;
              bitC.bitContainer[0] =
                   uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
              uVar14 = (ulong)((int)uVar14 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            }
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)((long)dst + ((uVar13 & 0xff) >> 3));
          }
          lVar5 = (long)(int)srcSize;
          if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) % 10)
              != 0) {
            lVar4 = 4;
            while (lVar4 != 0) {
              uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + lVar5 + -5) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar4 = lVar4 + -1;
            }
            lVar4 = lVar5 + -5;
            lVar5 = lVar5 + -5;
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4) + 1];
            bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
            uVar13 = bitC.bitPos[0] + uVar13;
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = bitC.ptr + ((uVar13 & 0xff) >> 3);
          }
          lVar8 = (long)src + lVar5 + -1;
          lVar4 = lVar5 + -6 + (long)src;
          for (; lVar12 = 4, 0 < lVar5; lVar5 = lVar5 + -10) {
            while (lVar12 != 0) {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -4 + lVar12) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar12 = lVar12 + -1;
            }
            uVar13 = CTable[(ulong)*(byte *)(lVar5 + -5 + (long)src) + 1];
            uVar15 = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
            uVar13 = bitC.bitPos[0] + uVar13;
            *(ulong *)bitC.ptr = uVar15 >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            lVar11 = 0;
            uVar14 = 0;
            lVar12 = 4;
            while (lVar12 != 0) {
              uVar1 = CTable[(ulong)*(byte *)(lVar4 + -4 + lVar12) + 1];
              uVar14 = uVar14 >> (uVar1 & 0x3f) | uVar1;
              lVar11 = lVar11 + uVar1;
              lVar12 = lVar12 + -1;
            }
            uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -10) + 1];
            bitC.bitContainer[1] = uVar14 >> (uVar1 & 0x3f) | uVar1;
            bitC.bitPos[1] = lVar11 + uVar1;
            bitC.bitContainer[0] = uVar15 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
            uVar14 = bitC.bitPos[1] + ((uint)uVar13 & 7);
            bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
            *(size_t *)(bitC.ptr + ((uVar13 & 0xff) >> 3)) =
                 bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
            bitC.ptr = (BYTE *)(((uVar14 & 0xff) >> 3) + (long)(bitC.ptr + ((uVar13 & 0xff) >> 3)));
            lVar8 = lVar8 + -10;
            lVar4 = lVar4 + -10;
          }
          break;
        case 0xb:
          uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 5;
          uVar14 = uVar13 & 0xffffffff;
          if (0 < (int)uVar13) {
            pbVar3 = (byte *)((long)iVar7 + (long)src);
            uVar13 = 0;
            while( true ) {
              pbVar3 = pbVar3 + -1;
              if ((int)uVar14 < 1) break;
              uVar15 = CTable[(ulong)*pbVar3 + 1];
              uVar13 = uVar13 + uVar15;
              bitC.bitContainer[0] =
                   uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
              uVar14 = (ulong)((int)uVar14 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            }
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)((long)dst + ((uVar13 & 0xff) >> 3));
          }
          iVar7 = (int)srcSize;
          if ((int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | srcSize & 0xffffffff) % 10) == 0)
          {
            lVar5 = (long)iVar7;
          }
          else {
            lVar4 = (long)iVar7;
            lVar5 = 4;
            while (lVar5 != 0) {
              uVar13 = CTable[(ulong)*(byte *)((long)src + lVar5 + lVar4 + -5) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar5 = lVar5 + -1;
            }
            lVar5 = lVar4 + -5;
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + -5) + 1];
            uVar14 = bitC.bitPos[0] + uVar13;
            bitC.bitContainer[0] =
                 uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
            *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
            bitC.ptr = bitC.ptr + ((uVar14 & 0xff) >> 3);
          }
          lVar8 = (long)src + lVar5 + -1;
          lVar4 = lVar5 + -6 + (long)src;
          for (; lVar12 = 4, 0 < lVar5; lVar5 = lVar5 + -10) {
            while (lVar12 != 0) {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -4 + lVar12) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar12 = lVar12 + -1;
            }
            uVar13 = CTable[(ulong)*(byte *)(lVar5 + -5 + (long)src) + 1];
            uVar15 = bitC.bitPos[0] + uVar13;
            uVar13 = uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
            *(ulong *)bitC.ptr = uVar13 >> ((ulong)(byte)-(char)uVar15 & 0x3f);
            lVar11 = 0;
            uVar14 = 0;
            lVar12 = 4;
            while (lVar12 != 0) {
              uVar1 = CTable[(ulong)*(byte *)(lVar4 + -4 + lVar12) + 1];
              uVar14 = uVar14 >> (uVar1 & 0x3f) | uVar1;
              lVar11 = lVar11 + uVar1;
              lVar12 = lVar12 + -1;
            }
            uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -10) + 1];
            bitC.bitPos[1] = lVar11 + uVar1;
            bitC.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar14 >> (uVar1 & 0x3f);
            bitC.bitContainer[0] = uVar13 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
            uVar13 = bitC.bitPos[1] + ((uint)uVar15 & 7);
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)(bitC.ptr + ((uVar15 & 0xff) >> 3)) =
                 bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)(((uVar13 & 0xff) >> 3) + (long)(bitC.ptr + ((uVar15 & 0xff) >> 3)));
            lVar8 = lVar8 + -10;
            lVar4 = lVar4 + -10;
          }
          break;
        default:
          uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 9;
          uVar14 = uVar13 & 0xffffffff;
          if (0 < (int)uVar13) {
            pbVar3 = (byte *)((long)iVar7 + (long)src);
            uVar13 = 0;
            while( true ) {
              pbVar3 = pbVar3 + -1;
              if ((int)uVar14 < 1) break;
              uVar15 = CTable[(ulong)*pbVar3 + 1];
              uVar13 = uVar13 + uVar15;
              bitC.bitContainer[0] =
                   uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
              uVar14 = (ulong)((int)uVar14 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            }
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = (BYTE *)((long)dst + ((uVar13 & 0xff) >> 3));
          }
          iVar7 = (int)srcSize;
          if ((int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | srcSize & 0xffffffff) % 0x12) == 0
             ) {
            lVar5 = (long)iVar7;
          }
          else {
            lVar4 = (long)iVar7;
            lVar5 = 8;
            while (lVar5 != 0) {
              uVar13 = CTable[(ulong)*(byte *)((long)src + lVar5 + lVar4 + -9) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar5 = lVar5 + -1;
            }
            lVar5 = lVar4 + -9;
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + -9) + 1];
            bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
            uVar13 = bitC.bitPos[0] + uVar13;
            bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
            *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            bitC.ptr = bitC.ptr + ((uVar13 & 0xff) >> 3);
          }
          lVar8 = (long)src + lVar5 + -1;
          lVar4 = lVar5 + -10 + (long)src;
          for (; lVar12 = 8, 0 < lVar5; lVar5 = lVar5 + -0x12) {
            while (lVar12 != 0) {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -8 + lVar12) + 1];
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
              lVar12 = lVar12 + -1;
            }
            uVar13 = CTable[(ulong)*(byte *)(lVar5 + -9 + (long)src) + 1];
            uVar15 = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
            uVar13 = bitC.bitPos[0] + uVar13;
            *(ulong *)bitC.ptr = uVar15 >> ((ulong)(byte)-(char)uVar13 & 0x3f);
            lVar11 = 0;
            uVar14 = 0;
            lVar12 = 8;
            while (lVar12 != 0) {
              uVar1 = CTable[(ulong)*(byte *)(lVar4 + -8 + lVar12) + 1];
              uVar14 = uVar14 >> (uVar1 & 0x3f) | uVar1;
              lVar11 = lVar11 + uVar1;
              lVar12 = lVar12 + -1;
            }
            uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -0x12) + 1];
            bitC.bitContainer[1] = uVar14 >> (uVar1 & 0x3f) | uVar1;
            bitC.bitPos[1] = lVar11 + uVar1;
            bitC.bitContainer[0] = uVar15 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
            uVar14 = bitC.bitPos[1] + ((uint)uVar13 & 7);
            bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
            *(size_t *)(bitC.ptr + ((uVar13 & 0xff) >> 3)) =
                 bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
            bitC.ptr = (BYTE *)(((uVar14 & 0xff) >> 3) + (long)(bitC.ptr + ((uVar13 & 0xff) >> 3)));
            lVar8 = lVar8 + -0x12;
            lVar4 = lVar4 + -0x12;
          }
        }
      }
      else {
        uVar13 = (long)((ulong)uVar9 << 0x20 | srcSize & 0xffffffff) % 4;
        uVar14 = uVar13 & 0xffffffff;
        if (0 < (int)uVar13) {
          pbVar3 = (byte *)((long)iVar7 + (long)src);
          uVar13 = 0;
          while( true ) {
            pbVar3 = pbVar3 + -1;
            if ((int)uVar14 < 1) break;
            uVar15 = CTable[(ulong)*pbVar3 + 1];
            uVar13 = uVar13 + uVar15;
            bitC.bitContainer[0] =
                 uVar15 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar15 & 0x3f);
            uVar14 = (ulong)((int)uVar14 - 1);
            srcSize = (size_t)((int)srcSize - 1);
          }
          bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
          bitC.ptr = (BYTE *)(((uVar13 & 0xff) >> 3) + (long)dst);
          if (bitC.endPtr < bitC.ptr) {
            bitC.ptr = bitC.endPtr;
          }
          *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
        }
        if ((srcSize & 7) == 0) {
          lVar5 = (long)(int)srcSize;
        }
        else {
          lVar4 = (long)(int)srcSize;
          lVar5 = 3;
          while (lVar5 != 0) {
            uVar13 = CTable[(ulong)*(byte *)((long)src + lVar5 + lVar4 + -4) + 1];
            bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
            bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
            lVar5 = lVar5 + -1;
          }
          lVar5 = lVar4 + -4;
          uVar13 = CTable[(ulong)*(byte *)((long)src + lVar4 + -4) + 1];
          uVar14 = bitC.bitPos[0] + uVar13;
          bitC.bitContainer[0] =
               uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
          bitC.bitPos[0] = (size_t)((uint)uVar14 & 7);
          puVar10 = (ulong *)(bitC.ptr + ((uVar14 & 0xff) >> 3));
          if (bitC.endPtr < bitC.ptr + ((uVar14 & 0xff) >> 3)) {
            puVar10 = (ulong *)bitC.endPtr;
          }
          *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar14 & 0x3f);
          bitC.ptr = (BYTE *)puVar10;
        }
        lVar8 = (long)src + lVar5 + -1;
        lVar4 = lVar5 + -5 + (long)src;
        for (; lVar12 = 3, 0 < lVar5; lVar5 = lVar5 + -8) {
          while (lVar12 != 0) {
            uVar13 = CTable[(ulong)*(byte *)(lVar8 + -3 + lVar12) + 1];
            bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar13 & 0x3f) | uVar13;
            bitC.bitPos[0] = bitC.bitPos[0] + uVar13;
            lVar12 = lVar12 + -1;
          }
          uVar13 = CTable[(ulong)*(byte *)(lVar5 + -4 + (long)src) + 1];
          uVar14 = bitC.bitPos[0] + uVar13;
          uVar13 = uVar13 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar13 & 0x3f);
          *(ulong *)bitC.ptr = uVar13 >> ((ulong)(byte)-(char)uVar14 & 0x3f);
          puVar10 = (ulong *)(bitC.ptr + ((uVar14 & 0xff) >> 3));
          if (bitC.endPtr < bitC.ptr + ((uVar14 & 0xff) >> 3)) {
            puVar10 = (ulong *)bitC.endPtr;
          }
          lVar11 = 0;
          uVar15 = 0;
          lVar12 = 3;
          while (lVar12 != 0) {
            uVar1 = CTable[(ulong)*(byte *)(lVar4 + -3 + lVar12) + 1];
            uVar15 = uVar15 >> (uVar1 & 0x3f) | uVar1;
            lVar11 = lVar11 + uVar1;
            lVar12 = lVar12 + -1;
          }
          uVar1 = CTable[(ulong)*(byte *)((long)src + lVar5 + -8) + 1];
          bitC.bitPos[1] = lVar11 + uVar1;
          bitC.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar15 >> (uVar1 & 0x3f);
          bitC.bitContainer[0] = uVar13 >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
          uVar13 = bitC.bitPos[1] + ((uint)uVar14 & 7);
          bitC.bitPos[0] = (size_t)((uint)uVar13 & 7);
          *puVar10 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar13 & 0x3f);
          bitC.ptr = (BYTE *)(((uVar13 & 0xff) >> 3) + (long)puVar10);
          if (bitC.endPtr < bitC.ptr) {
            bitC.ptr = bitC.endPtr;
          }
          lVar8 = lVar8 + -8;
          lVar4 = lVar4 + -8;
        }
      }
      bitC.startPtr = (BYTE *)dst;
      sVar6 = HUF_closeCStream(&bitC);
    }
    return sVar6;
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = HUF_readCTableHeader(CTable).tableLog;
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { BYTE* op = ostart;
      size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}